

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

void __thiscall
chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChValue *bVal,bool tracked,size_t obj_ID)

{
  int iVar1;
  char *pcVar2;
  ChStreamOutAscii *pCVar3;
  undefined4 extraout_var;
  size_t obj_ID_local;
  bool tracked_local;
  ChValue *bVal_local;
  ChArchiveAsciiDump *this_local;
  
  indent(this);
  if ((this->suppress_names & 1U) == 0) {
    pCVar3 = this->ostream;
    pcVar2 = ChValue::name(bVal);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,pcVar2);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"  ");
  }
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,"[");
  iVar1 = (*bVal->_vptr_ChValue[5])();
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,(char *)CONCAT44(extraout_var,iVar1));
  chrono::ChStreamOutAscii::operator<<(pCVar3,"]");
  if (tracked) {
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream," (tracked)   ID= ");
    chrono::ChStreamOutAscii::operator<<(pCVar3,obj_ID);
  }
  if (((this->super_ChArchiveOut).super_ChArchive.use_versions & 1U) != 0) {
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream," version=");
    iVar1 = (*bVal->_vptr_ChValue[4])();
    chrono::ChStreamOutAscii::operator<<(pCVar3,iVar1);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream," \n");
  *(int *)&(this->super_ChArchiveOut).field_0x104 =
       *(int *)&(this->super_ChArchiveOut).field_0x104 + 1;
  (*bVal->_vptr_ChValue[0xd])();
  *(int *)&(this->super_ChArchiveOut).field_0x104 =
       *(int *)&(this->super_ChArchiveOut).field_0x104 + -1;
  return;
}

Assistant:

virtual void out     (ChValue& bVal, bool tracked, size_t obj_ID) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "  "; 
            (*ostream) << "[" << bVal.GetTypeidName() << "]";
            if (tracked)
                (*ostream) << " (tracked)   ID= " << obj_ID; 
            if (this->use_versions)
                (*ostream) << " version=" << bVal.GetClassRegisteredVersion();
            (*ostream) << " \n";
            ++tablevel;
            bVal.CallArchiveOut(*this);
            --tablevel;
      }